

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr
xmlXPtrNewRangeInternal(xmlNodePtr start,int startindex,xmlNodePtr end,int endindex)

{
  xmlXPathObjectPtr ret;
  int endindex_local;
  xmlNodePtr end_local;
  int startindex_local;
  xmlNodePtr start_local;
  
  if ((start == (xmlNodePtr)0x0) || (start->type != XML_NAMESPACE_DECL)) {
    if ((end == (xmlNodePtr)0x0) || (end->type != XML_NAMESPACE_DECL)) {
      start_local = (xmlNodePtr)(*xmlMalloc)(0x48);
      if (start_local == (xmlNodePtr)0x0) {
        xmlXPtrErrMemory("allocating range");
        start_local = (xmlNodePtr)0x0;
      }
      else {
        memset(start_local,0,0x48);
        *(undefined4 *)&start_local->_private = 6;
        start_local->parent = start;
        *(int *)&start_local->next = startindex;
        start_local->prev = end;
        *(int *)&start_local->doc = endindex;
      }
    }
    else {
      start_local = (xmlNodePtr)0x0;
    }
  }
  else {
    start_local = (xmlNodePtr)0x0;
  }
  return (xmlXPathObjectPtr)start_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPtrNewRangeInternal(xmlNodePtr start, int startindex,
                        xmlNodePtr end, int endindex) {
    xmlXPathObjectPtr ret;

    /*
     * Namespace nodes must be copied (see xmlXPathNodeSetDupNs).
     * Disallow them for now.
     */
    if ((start != NULL) && (start->type == XML_NAMESPACE_DECL))
	return(NULL);
    if ((end != NULL) && (end->type == XML_NAMESPACE_DECL))
	return(NULL);

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating range");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlXPathObject));
    ret->type = XPATH_RANGE;
    ret->user = start;
    ret->index = startindex;
    ret->user2 = end;
    ret->index2 = endindex;
    return(ret);
}